

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O0

size_t DObject::StaticPointerSubstitution(DObject *old,DObject *notOld,bool scandefaults)

{
  PClassActor *type;
  bool bVar1;
  long lVar2;
  PClassActor **ppPVar3;
  size_t sVar4;
  FSectorPortal *pFVar5;
  AActor *pAVar6;
  FSectorPortal *s;
  iterator __end1;
  iterator __begin1;
  TArray<FSectorPortal,_FSectorPortal> *__range1;
  AActor *def;
  PClassActor *p;
  iterator __end2;
  iterator __begin2;
  TArray<PClassActor_*,_PClassActor_*> *__range2;
  DObject *last;
  size_t sStack_30;
  int i;
  size_t changed;
  DObject *probe;
  bool scandefaults_local;
  DObject *notOld_local;
  DObject *old_local;
  
  sStack_30 = 0;
  for (changed = GC::Root; changed != 0; changed = *(size_t *)(changed + 0x10)) {
    lVar2 = (**(code **)(*(long *)changed + 0x28))(changed,old,notOld);
    sStack_30 = lVar2 + sStack_30;
  }
  if (scandefaults) {
    __end2 = TArray<PClassActor_*,_PClassActor_*>::begin(&PClassActor::AllActorClasses);
    p = (PClassActor *)TArray<PClassActor_*,_PClassActor_*>::end(&PClassActor::AllActorClasses);
    while (bVar1 = TIterator<PClassActor_*>::operator!=(&__end2,(TIterator<PClassActor_*> *)&p),
          bVar1) {
      ppPVar3 = TIterator<PClassActor_*>::operator*(&__end2);
      type = *ppPVar3;
      pAVar6 = GetDefaultByType(&type->super_PClass);
      if (pAVar6 != (AActor *)0x0) {
        (pAVar6->super_DThinker).super_DObject.Class = &type->super_PClass;
        PointerSubstitution((DObject *)pAVar6,old,notOld);
        (pAVar6->super_DThinker).super_DObject.Class = (PClass *)0x0;
      }
      TIterator<PClassActor_*>::operator++(&__end2);
    }
  }
  for (last._4_4_ = 0; last._4_4_ < 0x20; last._4_4_ = last._4_4_ + 1) {
    if (bodyque[last._4_4_] == (AActor *)old) {
      bodyque[last._4_4_] = (AActor *)notOld;
      sStack_30 = sStack_30 + 1;
    }
  }
  for (last._4_4_ = 0; last._4_4_ < 8; last._4_4_ = last._4_4_ + 1) {
    if ((playeringame[last._4_4_] & 1U) != 0) {
      sVar4 = player_t::FixPointers((player_t *)(&players + (long)last._4_4_ * 0x54),old,notOld);
      sStack_30 = sVar4 + sStack_30;
    }
  }
  __end1 = TArray<FSectorPortal,_FSectorPortal>::begin(&sectorPortals);
  s = (FSectorPortal *)TArray<FSectorPortal,_FSectorPortal>::end(&sectorPortals);
  while (bVar1 = TIterator<FSectorPortal>::operator!=(&__end1,(TIterator<FSectorPortal> *)&s), bVar1
        ) {
    pFVar5 = TIterator<FSectorPortal>::operator*(&__end1);
    pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&pFVar5->mSkybox);
    if (pAVar6 == (AActor *)old) {
      TObjPtr<AActor>::operator=(&pFVar5->mSkybox,(AActor *)notOld);
      sStack_30 = sStack_30 + 1;
    }
    TIterator<FSectorPortal>::operator++(&__end1);
  }
  if (sectors != (sector_t_conflict *)0x0) {
    for (last._4_4_ = 0; last._4_4_ < numsectors; last._4_4_ = last._4_4_ + 1) {
      if (sectors[last._4_4_].SoundTarget.field_0.p == (AActor *)old) {
        TObjPtr<AActor>::operator=(&sectors[last._4_4_].SoundTarget,(AActor *)notOld);
        sStack_30 = sStack_30 + 1;
      }
      if ((DObject *)sectors[last._4_4_].SecActTarget.field_0.p == old) {
        TObjPtr<ASectorAction>::operator=(&sectors[last._4_4_].SecActTarget,(ASectorAction *)notOld)
        ;
        sStack_30 = sStack_30 + 1;
      }
      if (sectors[last._4_4_].floordata.field_0.p == (DSectorEffect *)old) {
        TObjPtr<DSectorEffect>::operator=(&sectors[last._4_4_].floordata,(DSectorEffect *)notOld);
        sStack_30 = sStack_30 + 1;
      }
      if (sectors[last._4_4_].ceilingdata.field_0.p == (DSectorEffect *)old) {
        TObjPtr<DSectorEffect>::operator=(&sectors[last._4_4_].ceilingdata,(DSectorEffect *)notOld);
        sStack_30 = sStack_30 + 1;
      }
      if (sectors[last._4_4_].lightingdata.field_0.p == (DSectorEffect *)old) {
        TObjPtr<DSectorEffect>::operator=(&sectors[last._4_4_].lightingdata,(DSectorEffect *)notOld)
        ;
        sStack_30 = sStack_30 + 1;
      }
    }
  }
  if (bglobal.firstthing.field_0 == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)old) {
    TObjPtr<AActor>::operator=(&bglobal.firstthing,(AActor *)notOld);
    sStack_30 = sStack_30 + 1;
  }
  if (bglobal.body1.field_0 == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)old) {
    TObjPtr<AActor>::operator=(&bglobal.body1,(AActor *)notOld);
    sStack_30 = sStack_30 + 1;
  }
  if (bglobal.body2.field_0 == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)old) {
    TObjPtr<AActor>::operator=(&bglobal.body2,(AActor *)notOld);
    sStack_30 = sStack_30 + 1;
  }
  return sStack_30;
}

Assistant:

size_t DObject::StaticPointerSubstitution (DObject *old, DObject *notOld, bool scandefaults)
{
	DObject *probe;
	size_t changed = 0;
	int i;

	// Go through all objects.
	i = 0;DObject *last=0;
	for (probe = GC::Root; probe != NULL; probe = probe->ObjNext)
	{
		i++;
		changed += probe->PointerSubstitution(old, notOld);
		last = probe;
	}

	if (scandefaults)
	{
		for (auto p : PClassActor::AllActorClasses)
		{
			auto def = GetDefaultByType(p);
			if (def != nullptr)
			{
				def->Class = p;
				def->DObject::PointerSubstitution(old, notOld);
				def->Class = nullptr;	// reset pointer. Defaults should not have a valid class pointer.
			}
		}
	}

	// Go through the bodyque.
	for (i = 0; i < BODYQUESIZE; ++i)
	{
		if (bodyque[i] == old)
		{
			bodyque[i] = static_cast<AActor *>(notOld);
			changed++;
		}
	}

	// Go through players.
	for (i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
			changed += players[i].FixPointers (old, notOld);
	}

	for (auto &s : sectorPortals)
	{
		if (s.mSkybox == old)
		{
			s.mSkybox = static_cast<ASkyViewpoint*>(notOld);
			changed++;
		}
	}

	// Go through sectors.
	if (sectors != NULL)
	{
		for (i = 0; i < numsectors; ++i)
		{
#define SECTOR_CHECK(f,t) \
	if (sectors[i].f.p == static_cast<t *>(old)) { sectors[i].f = static_cast<t *>(notOld); changed++; }
			SECTOR_CHECK( SoundTarget, AActor );
			SECTOR_CHECK( SecActTarget, ASectorAction );
			SECTOR_CHECK( floordata, DSectorEffect );
			SECTOR_CHECK( ceilingdata, DSectorEffect );
			SECTOR_CHECK( lightingdata, DSectorEffect );
#undef SECTOR_CHECK
		}
	}

	// Go through bot stuff.
	if (bglobal.firstthing.p == (AActor *)old)		bglobal.firstthing = (AActor *)notOld, ++changed;
	if (bglobal.body1.p == (AActor *)old)			bglobal.body1 = (AActor *)notOld, ++changed;
	if (bglobal.body2.p == (AActor *)old)			bglobal.body2 = (AActor *)notOld, ++changed;

	return changed;
}